

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O2

uint64_t bitmanip::detail::remIleavedBits_shift<1u>(uint64_t input)

{
  uint64_t uVar1;
  size_t i;
  long lVar2;
  ulong local_30 [6];
  
  local_30[0] = 0x3333333333333333;
  local_30[1] = 0xf0f0f0f0f0f0f0f;
  local_30[2] = 0xff00ff00ff00ff;
  local_30[3] = 0xffff0000ffff;
  local_30[4] = 0xffffffff;
  uVar1 = input & 0x5555555555555555;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uVar1 = (uVar1 >> ((byte)(1 << ((byte)lVar2 & 0x1f)) & 0x3f) | uVar1) & local_30[lVar2];
  }
  return uVar1;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t remIleavedBits_shift(std::uint64_t input) noexcept
{
    if constexpr (BITS == 0) {
        return input;
    }
    else {
        constexpr std::uint64_t MASKS[] = {
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 1),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 2),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 4),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 8),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 16),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 32),
        };
        // log2_floor(0) == 0 so this is always safe, even for 1 bit
        constexpr std::size_t iterations = 5 - bitmanip::log2floor(BITS >> 1);

        input &= MASKS[0];

        for (std::size_t i = 0; i < iterations; ++i) {
            unsigned rshift = (1u << i) * BITS;
            input |= input >> rshift;
            input &= MASKS[i + 1];
        }

        return input;
    }
}